

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

void __thiscall
TPZAutoPointer<TPZDohrAssembly<double>_>::Release(TPZAutoPointer<TPZDohrAssembly<double>_> *this)

{
  TPZDohrAssembly<double> *pTVar1;
  __int_type _Var2;
  TPZReference *in_RDI;
  
  if (((in_RDI->fPointer != (TPZDohrAssembly<double> *)0x0) &&
      (_Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_RDI), _Var2 == 0))
     && (pTVar1 = in_RDI->fPointer, pTVar1 != (TPZDohrAssembly<double> *)0x0)) {
    TPZReference::~TPZReference(in_RDI);
    operator_delete(pTVar1,0x10);
  }
  in_RDI->fPointer = (TPZDohrAssembly<double> *)0x0;
  return;
}

Assistant:

inline void Release(){
        if(fRef && ! fRef->fCounter) {
            delete fRef;
        }
        fRef = nullptr;
    }